

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O0

double av1_get_gfu_boost_projection_factor(double min_factor,double max_factor,int frame_count)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double factor;
  double local_30;
  double local_28;
  
  dVar1 = sqrt((double)in_EDI);
  local_28 = in_XMM1_Qa;
  if (dVar1 < in_XMM1_Qa) {
    local_28 = dVar1;
  }
  local_30 = in_XMM0_Qa;
  if (in_XMM0_Qa < local_28) {
    local_30 = local_28;
  }
  return local_30 * 10.0 + 200.0;
}

Assistant:

static inline double av1_get_gfu_boost_projection_factor(double min_factor,
                                                         double max_factor,
                                                         int frame_count) {
  double factor = sqrt((double)frame_count);
  factor = AOMMIN(factor, max_factor);
  factor = AOMMAX(factor, min_factor);
  factor = (200.0 + 10.0 * factor);
  return factor;
}